

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_ConvertFromConfidentialValue_Test::
ConfidentialValue_ConvertFromConfidentialValue_Test
          (ConfidentialValue_ConvertFromConfidentialValue_Test *this)

{
  ConfidentialValue_ConvertFromConfidentialValue_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialValue_ConvertFromConfidentialValue_Test_008948f8;
  return;
}

Assistant:

TEST(ConfidentialValue, ConvertFromConfidentialValue) {
  ByteData value("010000000005f5e100");
  Amount amount = ConfidentialValue::ConvertFromConfidentialValue(value);
  EXPECT_EQ(amount.GetSatoshiValue(), 100000000);

  EXPECT_THROW(
      ConfidentialValue::ConvertFromConfidentialValue(ByteData("001122")),
      CfdException);
}